

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::Locale::Locale
          (Locale *this,char *newLanguage,char *newCountry,char *newVariant,char *newKeywords)

{
  UBool UVar1;
  size_t sVar2;
  CharString *this_00;
  char *pcVar3;
  EVP_PKEY_CTX *ctx;
  bool bVar4;
  StringPiece s;
  StringPiece s_00;
  undefined1 local_c0 [12];
  undefined1 local_b0 [12];
  undefined4 local_9c;
  undefined1 local_98 [8];
  CharString togo;
  int local_50;
  int32_t ksize;
  int32_t vsize;
  int32_t csize;
  int32_t lsize;
  int32_t size;
  UErrorCode status;
  char *local_30;
  char *newKeywords_local;
  char *newVariant_local;
  char *newCountry_local;
  char *newLanguage_local;
  Locale *this_local;
  
  local_30 = newKeywords;
  newKeywords_local = newVariant;
  newVariant_local = newCountry;
  newCountry_local = newLanguage;
  newLanguage_local = (char *)this;
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Locale_004a1d20;
  this->fullName = this->fullNameBuffer;
  this->baseName = (char *)0x0;
  if (((newCountry_local == (char *)0x0) && (newVariant_local == (char *)0x0)) &&
     (newKeywords_local == (char *)0x0)) {
    init(this,(EVP_PKEY_CTX *)0x0);
    return;
  }
  lsize = 0;
  vsize = 0;
  ksize = 0;
  local_50 = 0;
  togo._60_4_ = 0;
  if (newCountry_local != (char *)0x0) {
    sVar2 = strlen(newCountry_local);
    vsize = (int32_t)sVar2;
    if ((vsize < 0) || (0x15555555 < vsize)) {
      setToBogus(this);
      return;
    }
  }
  CharString::CharString((CharString *)local_98,newCountry_local,vsize,&lsize);
  if (newVariant_local != (char *)0x0) {
    sVar2 = strlen(newVariant_local);
    ksize = (int32_t)sVar2;
    if ((ksize < 0) || (0x15555555 < ksize)) {
      setToBogus(this);
      local_9c = 1;
      goto LAB_003250b7;
    }
  }
  if (newKeywords_local != (char *)0x0) {
    for (; *newKeywords_local == '_'; newKeywords_local = newKeywords_local + 1) {
    }
    sVar2 = strlen(newKeywords_local);
    local_50 = (int)sVar2;
    if ((local_50 < 0) || (0x15555555 < local_50)) {
      setToBogus(this);
      local_9c = 1;
      goto LAB_003250b7;
    }
    while( true ) {
      bVar4 = false;
      if (1 < local_50) {
        bVar4 = newKeywords_local[local_50 + -1] == '_';
      }
      if (!bVar4) break;
      local_50 = local_50 + -1;
    }
  }
  if (local_30 != (char *)0x0) {
    sVar2 = strlen(local_30);
    togo._60_4_ = SUB84(sVar2,0);
    if (((int)togo._60_4_ < 0) || (0x15555555 < (int)togo._60_4_)) {
      setToBogus(this);
      local_9c = 1;
      goto LAB_003250b7;
    }
  }
  if ((local_50 != 0) || (ksize != 0)) {
    CharString::append((CharString *)local_98,'_',&lsize);
  }
  if (ksize != 0) {
    StringPiece::StringPiece((StringPiece *)local_b0,newVariant_local);
    s._12_4_ = 0;
    s.ptr_ = (char *)local_b0._0_8_;
    s.length_ = local_b0._8_4_;
    CharString::append((CharString *)local_98,s,&lsize);
  }
  if (local_50 != 0) {
    this_00 = CharString::append((CharString *)local_98,'_',&lsize);
    CharString::append(this_00,newKeywords_local,local_50,&lsize);
  }
  if (togo._60_4_ != 0) {
    pcVar3 = strchr(local_30,0x3d);
    if (pcVar3 == (char *)0x0) {
      CharString::append((CharString *)local_98,'_',&lsize);
      if (local_50 == 0) {
        CharString::append((CharString *)local_98,'_',&lsize);
      }
    }
    else {
      CharString::append((CharString *)local_98,'@',&lsize);
    }
    StringPiece::StringPiece((StringPiece *)local_c0,local_30);
    s_00._12_4_ = 0;
    s_00.ptr_ = (char *)local_c0._0_8_;
    s_00.length_ = local_c0._8_4_;
    CharString::append((CharString *)local_98,s_00,&lsize);
  }
  UVar1 = ::U_FAILURE(lsize);
  if (UVar1 == '\0') {
    ctx = (EVP_PKEY_CTX *)CharString::data((CharString *)local_98);
    init(this,ctx);
    local_9c = 0;
  }
  else {
    setToBogus(this);
    local_9c = 1;
  }
LAB_003250b7:
  CharString::~CharString((CharString *)local_98);
  return;
}

Assistant:

Locale::Locale( const   char * newLanguage,
                const   char * newCountry,
                const   char * newVariant,
                const   char * newKeywords)
    : UObject(), fullName(fullNameBuffer), baseName(NULL)
{
    if( (newLanguage==NULL) && (newCountry == NULL) && (newVariant == NULL) )
    {
        init(NULL, FALSE); /* shortcut */
    }
    else
    {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = 0;
        int32_t lsize = 0;
        int32_t csize = 0;
        int32_t vsize = 0;
        int32_t ksize = 0;

        // Calculate the size of the resulting string.

        // Language
        if ( newLanguage != NULL )
        {
            lsize = (int32_t)uprv_strlen(newLanguage);
            if ( lsize < 0 || lsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size = lsize;
        }

        CharString togo(newLanguage, lsize, status); // start with newLanguage

        // _Country
        if ( newCountry != NULL )
        {
            csize = (int32_t)uprv_strlen(newCountry);
            if ( csize < 0 || csize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size += csize;
        }

        // _Variant
        if ( newVariant != NULL )
        {
            // remove leading _'s
            while(newVariant[0] == SEP_CHAR)
            {
                newVariant++;
            }

            // remove trailing _'s
            vsize = (int32_t)uprv_strlen(newVariant);
            if ( vsize < 0 || vsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            while( (vsize>1) && (newVariant[vsize-1] == SEP_CHAR) )
            {
                vsize--;
            }
        }

        if( vsize > 0 )
        {
            size += vsize;
        }

        // Separator rules:
        if ( vsize > 0 )
        {
            size += 2;  // at least: __v
        }
        else if ( csize > 0 )
        {
            size += 1;  // at least: _v
        }

        if ( newKeywords != NULL)
        {
            ksize = (int32_t)uprv_strlen(newKeywords);
            if ( ksize < 0 || ksize > ULOC_STRING_LIMIT ) {
              setToBogus();
              return;
            }
            size += ksize + 1;
        }

        //  NOW we have the full locale string..
        // Now, copy it back.

        // newLanguage is already copied

        if ( ( vsize != 0 ) || (csize != 0) )  // at least:  __v
        {                                      //            ^
            togo.append(SEP_CHAR, status);
        }

        if ( csize != 0 )
        {
            togo.append(newCountry, status);
        }

        if ( vsize != 0)
        {
            togo.append(SEP_CHAR, status)
                .append(newVariant, vsize, status);
        }

        if ( ksize != 0)
        {
            if (uprv_strchr(newKeywords, '=')) {
                togo.append('@', status); /* keyword parsing */
            }
            else {
                togo.append('_', status); /* Variant parsing with a script */
                if ( vsize == 0) {
                    togo.append('_', status); /* No country found */
                }
            }
            togo.append(newKeywords, status);
        }

        if (U_FAILURE(status)) {
            // Something went wrong with appending, etc.
            setToBogus();
            return;
        }
        // Parse it, because for example 'language' might really be a complete
        // string.
        init(togo.data(), FALSE);
    }
}